

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemReadIOCallback.cpp
# Opt level: O2

ssize_t __thiscall
libebml::MemReadIOCallback::read(MemReadIOCallback *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  uint8 *__n;
  
  __n = this->mEnd + -(long)this->mPtr;
  if (__buf <= this->mEnd + -(long)this->mPtr) {
    __n = (uint8 *)__buf;
  }
  memcpy((void *)CONCAT44(in_register_00000034,__fd),this->mPtr,(size_t)__n);
  this->mPtr = this->mPtr + (long)__n;
  return (ulong)__n & 0xffffffff;
}

Assistant:

uint32
MemReadIOCallback::read(void *Buffer,
                        size_t Size) {
  size_t RemainingBytes = mEnd - mPtr;
  if (RemainingBytes < Size)
    Size = RemainingBytes;

  std::memcpy(Buffer, mPtr, Size);
  mPtr += Size;

  return Size;
}